

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::GoniometricLight::PDF_Le(GoniometricLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  
  auVar5 = in_ZMM0._8_56_;
  *pdfPos = 0.0;
  VVar6 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  local_40.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_40._0_8_ = vmovlps_avx(auVar3._0_16_);
  VVar6 = Normalize<float>((Vector3<float> *)&local_40);
  local_30.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_30._0_8_ = vmovlps_avx(auVar4._0_16_);
  fVar1 = SafeACos(local_30.z);
  local_40.x = SphericalPhi((Vector3f *)&local_30);
  local_40.y = fVar1;
  FVar2 = PiecewiseConstant2D::PDF(&this->distrib,(Point2f *)&local_40);
  fVar1 = sinf(fVar1);
  *pdfDir = FVar2 / fVar1;
  return;
}

Assistant:

void GoniometricLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0.f;

    Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
    Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
    *pdfDir = distrib.PDF(Point2f(phi, theta)) / std::sin(theta);
}